

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O1

void __thiscall HighsLpRelaxation::removeObsoleteRows(HighsLpRelaxation *this,bool notifyPool)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  HighsInt ndelcuts;
  vector<int,_std::allocator<int>_> deletemask;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar1 = (this->lpsolver).model_.lp_.num_row_;
  iVar4 = this->mipsolver->model_->num_row_;
  lVar3 = (long)iVar4;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ndelcuts = 0;
  if (iVar1 != iVar4) {
    lVar2 = lVar3 * 3 + 1;
    iVar4 = iVar1 - iVar4;
    ndelcuts = 0;
    do {
      if ((this->lpsolver).basis_.row_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] == kBasic) {
        if (ndelcuts == 0) {
          std::vector<int,_std::allocator<int>_>::resize(&local_48,(long)iVar1);
        }
        ndelcuts = ndelcuts + 1;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar3] = 1;
        if (notifyPool) {
          HighsCutPool::lpCutRemoved
                    (&((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool,
                     (&((this->lprows).
                        super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                        ._M_impl.super__Vector_impl_data._M_start)->origin)[lVar2]);
        }
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 3;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  removeCuts(this,ndelcuts,&local_48);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsLpRelaxation::removeObsoleteRows(bool notifyPool) {
  HighsInt nlprows = numRows();
  HighsInt nummodelrows = getNumModelRows();
  std::vector<HighsInt> deletemask;

  HighsInt ndelcuts = 0;
  for (HighsInt i = nummodelrows; i != nlprows; ++i) {
    assert(lprows[i].origin == LpRow::Origin::kCutPool);
    if (lpsolver.getBasis().row_status[i] == HighsBasisStatus::kBasic) {
      if (ndelcuts == 0) deletemask.resize(nlprows);
      ++ndelcuts;
      deletemask[i] = 1;
      if (notifyPool) mipsolver.mipdata_->cutpool.lpCutRemoved(lprows[i].index);
    }
  }

  removeCuts(ndelcuts, deletemask);
}